

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O3

size_t IoTHubAccount_GetIoTHubPartitionCount(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  char *__nptr;
  size_t sVar2;
  
  __nptr = getenv("IOTHUB_PARTITION_COUNT");
  if (__nptr == (char *)0x0) {
    sVar2 = 0x10;
  }
  else {
    iVar1 = atoi(__nptr);
    sVar2 = (size_t)iVar1;
  }
  return sVar2;
}

Assistant:

const size_t IoTHubAccount_GetIoTHubPartitionCount(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    int value;
    (void)acctHandle;
#ifdef MBED_BUILD_TIMESTAMP
    char* str_value;
    if ((str_value = getMbedParameter("IOTHUB_PARTITION_COUNT")) != NULL)
    {
        sscanf(str_value, "%i", &value);
    }
#else
    char *envVarValue = getenv("IOTHUB_PARTITION_COUNT");
    if (envVarValue != NULL)
    {
        value = atoi(envVarValue);
    }
    else
    {
        value = DEFAULT_PARTITION_COUNT;
    }
#endif
    return (size_t)value;
}